

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcesDictionary.cpp
# Opt level: O1

string * __thiscall
ResourcesDictionary::AddExtGStateMapping_abi_cxx11_
          (string *__return_storage_ptr__,ResourcesDictionary *this,ObjectIDType inExtGStateID)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  long lVar3;
  long *plVar4;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var5;
  _Base_ptr p_Var6;
  long *plVar7;
  size_type *psVar8;
  string *newName_1;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar9;
  string newName;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  undefined1 local_68 [24];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  long local_30;
  
  if (inExtGStateID == 0) {
    local_50 = (long *)(this->mExtGStatesCount + 1);
    BoxingBaseWithRW<unsigned_long,STDStreamsReader<unsigned_long>,STDStreamsWriter<unsigned_long>>
    ::ToString_abi_cxx11_((string *)local_78,&local_50);
    plVar4 = (long *)std::__cxx11::string::replace
                               ((ulong)local_78,0,(char *)0x0,
                                (ulong)scGS_abi_cxx11_._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar8) {
      lVar3 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_78 != (undefined1  [8])local_68) {
      operator_delete((void *)local_78,local_68._0_8_ + 1);
    }
    this->mExtGStatesCount = this->mExtGStatesCount + 1;
  }
  else {
    p_Var1 = &(this->mXObjects)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = (this->mXObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    for (; p_Var2 != (_Base_ptr)0x0;
        p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < inExtGStateID]) {
      if (*(ulong *)(p_Var2 + 1) >= inExtGStateID) {
        p_Var6 = p_Var2;
      }
    }
    _Var5._M_node = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (_Var5._M_node = p_Var6, inExtGStateID < *(ulong *)(p_Var6 + 1))) {
      _Var5._M_node = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)_Var5._M_node == p_Var1) {
      local_30 = this->mExtGStatesCount + 1;
      BoxingBaseWithRW<unsigned_long,STDStreamsReader<unsigned_long>,STDStreamsWriter<unsigned_long>>
      ::ToString_abi_cxx11_((string *)local_78,&local_30);
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_78,0,(char *)0x0,
                                  (ulong)scGS_abi_cxx11_._M_dataplus._M_p);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_40 = *plVar7;
        lStack_38 = plVar4[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar7;
        local_50 = (long *)*plVar4;
      }
      local_48 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_78 != (undefined1  [8])local_68) {
        operator_delete((void *)local_78,local_68._0_8_ + 1);
      }
      this->mExtGStatesCount = this->mExtGStatesCount + 1;
      local_78 = (undefined1  [8])inExtGStateID;
      local_70._M_p = local_68 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_50,local_48 + (long)local_50);
      pVar9 = std::
              _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
              ::_M_insert_unique<std::pair<unsigned_long_const,std::__cxx11::string>>
                        ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                          *)&this->mExtGStates,
                         (pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_78);
      _Var5 = pVar9.first._M_node;
      if (local_70._M_p != local_68 + 8) {
        operator_delete(local_70._M_p,local_68._8_8_ + 1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,_Var5._M_node[1]._M_parent,
               (long)&(_Var5._M_node[1]._M_parent)->_M_color +
               (long)&(_Var5._M_node[1]._M_left)->_M_color);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ResourcesDictionary::AddExtGStateMapping(ObjectIDType inExtGStateID)
{
    if(inExtGStateID == 0)
    {
        std::string newName = scGS + ULong(mExtGStatesCount+1).ToString();
        ++mExtGStatesCount;
        return newName;
    }
    else 
    {
        ObjectIDTypeToStringMap::iterator it = mXObjects.find(inExtGStateID);
        
        if(it == mXObjects.end())
        {
            std::string newName = scGS + ULong(mExtGStatesCount+1).ToString();
            ++mExtGStatesCount;
            it = mExtGStates.insert(ObjectIDTypeToStringMap::value_type(inExtGStateID,newName)).first;
        }
        return it->second;
    }
}